

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void idct64_stage11_avx2(__m256i *u,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo,
                        __m256i *clamp_hi)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  __m256i alVar5;
  undefined1 auVar6 [32];
  int iVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  __m256i clamp_lo_out;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  
  lVar8 = 0x7e0;
  lVar9 = 0;
  do {
    auVar1 = *(undefined1 (*) [32])((long)*u + lVar9);
    auVar2 = *(undefined1 (*) [32])((long)*u + lVar8);
    auVar3 = vpaddd_avx2(auVar2,auVar1);
    auVar6 = vpsubd_avx2(auVar1,auVar2);
    auVar1 = vpmaxsd_avx2(auVar3,(undefined1  [32])*clamp_lo);
    auVar2 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    auVar1 = vpmaxsd_avx2(auVar6,(undefined1  [32])*clamp_lo);
    auVar1 = vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
    *(undefined1 (*) [32])((long)*out + lVar9) = auVar2;
    *(undefined1 (*) [32])((long)*out + lVar8) = auVar1;
    lVar8 = lVar8 + -0x20;
    lVar9 = lVar9 + 0x20;
  } while (lVar8 != 0x3e0);
  if (do_cols == 0) {
    iVar7 = 10;
    if (10 < bd) {
      iVar7 = bd;
    }
    local_80 = 0x20 << ((byte)iVar7 & 0x1f);
    local_60 = -local_80;
    local_80 = local_80 + -1;
    if (out_shift != 0) {
      iVar7 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar11._4_4_ = iVar7;
      auVar11._0_4_ = iVar7;
      auVar11._8_4_ = iVar7;
      auVar11._12_4_ = iVar7;
      auVar11._16_4_ = iVar7;
      auVar11._20_4_ = iVar7;
      auVar11._24_4_ = iVar7;
      auVar11._28_4_ = iVar7;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])*out);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[1]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[2]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[3]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)out_shift));
      alVar5 = (__m256i)vpsrad_avx2(auVar2,ZEXT416((uint)out_shift));
      *out = alVar4;
      out[1] = alVar5;
      auVar10 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[2] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[3] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[4]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[5]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[6]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[7]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[4] = alVar4;
      out[5] = alVar5;
      auVar10 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[6] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[7] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[8]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[9]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[10]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0xb]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[8] = alVar4;
      out[9] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[10] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0xb] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0xc]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0xd]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0xe]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0xf]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0xc] = alVar4;
      out[0xd] = alVar5;
      auVar10 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0xe] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0xf] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x10]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x11]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x12]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x13]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x10] = alVar4;
      out[0x11] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x12] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x13] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x14]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x15]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x16]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x17]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x14] = alVar4;
      out[0x15] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x16] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x17] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x18]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x19]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x1a]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x1b]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x18] = alVar4;
      out[0x19] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x1a] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x1b] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x1c]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x1d]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x1e]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x1f]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x1c] = alVar4;
      out[0x1d] = alVar5;
      auVar10 = ZEXT416((uint)out_shift);
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x1e] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x1f] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x20]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x21]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x22]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x23]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x20] = alVar4;
      out[0x21] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x22] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x23] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x24]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x25]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x26]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x27]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x24] = alVar4;
      out[0x25] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x26] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x27] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x28]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x29]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x2a]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x2b]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x28] = alVar4;
      out[0x29] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x2a] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x2b] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x2c]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x2d]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x2e]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x2f]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x2c] = alVar4;
      out[0x2d] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x2e] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x2f] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x30]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x31]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x32]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x33]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x30] = alVar4;
      out[0x31] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x32] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x33] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x34]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x35]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x36]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x37]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x34] = alVar4;
      out[0x35] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x36] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x37] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x38]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x39]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x3a]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x3b]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x38] = alVar4;
      out[0x39] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,auVar10);
      out[0x3a] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,auVar10);
      out[0x3b] = alVar4;
      auVar1 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x3c]);
      auVar2 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x3d]);
      auVar3 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x3e]);
      auVar6 = vpaddd_avx2(auVar11,(undefined1  [32])out[0x3f]);
      alVar4 = (__m256i)vpsrad_avx2(auVar1,auVar10);
      alVar5 = (__m256i)vpsrad_avx2(auVar2,auVar10);
      out[0x3c] = alVar4;
      out[0x3d] = alVar5;
      alVar4 = (__m256i)vpsrad_avx2(auVar3,ZEXT416((uint)out_shift));
      out[0x3e] = alVar4;
      alVar4 = (__m256i)vpsrad_avx2(auVar6,ZEXT416((uint)out_shift));
      out[0x3f] = alVar4;
    }
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    iStack_5c = local_60;
    iStack_58 = local_60;
    iStack_54 = local_60;
    iStack_50 = local_60;
    iStack_4c = local_60;
    iStack_48 = local_60;
    iStack_44 = local_60;
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_60,(__m256i *)&local_80,0x40);
  }
  return;
}

Assistant:

static inline void idct64_stage11_avx2(__m256i *u, __m256i *out, int do_cols,
                                       int bd, int out_shift,
                                       const __m256i *clamp_lo,
                                       const __m256i *clamp_hi) {
  for (int i = 0; i < 32; i++) {
    addsub_avx2(u[i], u[63 - i], &out[(i)], &out[(63 - i)], clamp_lo, clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_8x8_avx2(out, out_shift);
    round_shift_8x8_avx2(out + 16, out_shift);
    round_shift_8x8_avx2(out + 32, out_shift);
    round_shift_8x8_avx2(out + 48, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 64);
  }
}